

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<n_e_s::core::INesController::Button>,testing::Matcher<bool>>,std::tuple<n_e_s::core::INesController::Button,bool>>
               (tuple<testing::Matcher<n_e_s::core::INesController::Button>,_testing::Matcher<bool>_>
                *matchers,tuple<n_e_s::core::INesController::Button,_bool> *values,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<bool> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  MatchResultListener local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<n_e_s::core::INesController::Button>,testing::Matcher<bool>>,std::tuple<n_e_s::core::INesController::Button,bool>>
            (matchers,values,os);
  local_1f8.vtable_ =
       (matchers->
       super__Tuple_impl<0UL,_testing::Matcher<n_e_s::core::INesController::Button>,_testing::Matcher<bool>_>
       ).super__Tuple_impl<1UL,_testing::Matcher<bool>_>.
       super__Head_base<1UL,_testing::Matcher<bool>,_false>._M_head_impl.super_MatcherBase<bool>.
       vtable_;
  local_1f8.buffer_ =
       (Buffer)(matchers->
               super__Tuple_impl<0UL,_testing::Matcher<n_e_s::core::INesController::Button>,_testing::Matcher<bool>_>
               ).super__Tuple_impl<1UL,_testing::Matcher<bool>_>.
               super__Head_base<1UL,_testing::Matcher<bool>,_false>._M_head_impl.
               super_MatcherBase<bool>.buffer_.shared;
  if ((local_1f8.vtable_ != (VTable *)0x0) &&
     ((local_1f8.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_1f8.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_1f8.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1f8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002adee0;
  local_1c0.stream_ = local_1a0;
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_002a0af8;
  std::__cxx11::stringstream::stringstream(local_1b0);
  bVar1 = MatcherBase<bool>::MatchAndExplain(&local_1f8,(bool *)values,&local_1c0);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    MatcherBase<bool>::DescribeTo((MatcherBase<bool> *)matchers,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    uVar4 = (ulong)(values->super__Tuple_impl<0UL,_n_e_s::core::INesController::Button,_bool>).
                   super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl;
    pcVar5 = "false";
    if (uVar4 != 0) {
      pcVar5 = "true";
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,uVar4 ^ 5);
    std::__cxx11::stringbuf::str();
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&local_1e0,"");
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_002a0af8;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  MatcherBase<bool>::~MatcherBase(&local_1f8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }